

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

If_DsdObj_t * If_DsdObjAlloc(If_DsdMan_t *p,int Type,int nFans)

{
  uint uVar1;
  If_DsdObj_t *pIVar2;
  void **ppvVar3;
  int iVar4;
  
  pIVar2 = (If_DsdObj_t *)
           Mem_FlexEntryFetch(p->pMem,((nFans & 1U) + ((uint)(nFans - (nFans >> 0x1f)) >> 1)) * 8 +
                                      8);
  *pIVar2 = (If_DsdObj_t)0x0;
  uVar1 = *(uint *)&pIVar2->field_0x4;
  *(uint *)&pIVar2->field_0x4 = nFans << 0x1b | uVar1 & 0x7fffff8 | Type & 7U;
  pIVar2->Id = (p->vObjs).nSize;
  *(uint *)&pIVar2->field_0x4 =
       nFans << 0x1b | uVar1 & 0xf8 | Type & 7U | (p->fNewAsUseless & 1U) << 8;
  uVar1 = (p->vObjs).nCap;
  if ((p->vObjs).nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      ppvVar3 = (p->vObjs).pArray;
      if (ppvVar3 == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(ppvVar3,0x80);
      }
      (p->vObjs).pArray = ppvVar3;
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar1 * 2;
      if (iVar4 <= (int)uVar1) goto LAB_0041d701;
      ppvVar3 = (p->vObjs).pArray;
      if (ppvVar3 == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(ppvVar3,(ulong)uVar1 << 4);
      }
      (p->vObjs).pArray = ppvVar3;
    }
    (p->vObjs).nCap = iVar4;
  }
LAB_0041d701:
  iVar4 = (p->vObjs).nSize;
  (p->vObjs).nSize = iVar4 + 1;
  (p->vObjs).pArray[iVar4] = pIVar2;
  Vec_IntPush(&p->vNexts,0);
  Vec_IntPush(&p->vTruths,-1);
  iVar4 = (p->vObjs).nSize;
  if ((p->vNexts).nSize != iVar4) {
    __assert_fail("Vec_IntSize(&p->vNexts) == Vec_PtrSize(&p->vObjs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x104,"If_DsdObj_t *If_DsdObjAlloc(If_DsdMan_t *, int, int)");
  }
  if ((p->vTruths).nSize == iVar4) {
    return pIVar2;
  }
  __assert_fail("Vec_IntSize(&p->vTruths) == Vec_PtrSize(&p->vObjs)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                ,0x105,"If_DsdObj_t *If_DsdObjAlloc(If_DsdMan_t *, int, int)");
}

Assistant:

If_DsdObj_t * If_DsdObjAlloc( If_DsdMan_t * p, int Type, int nFans )
{
    int nWords = If_DsdObjWordNum( nFans );
    If_DsdObj_t * pObj = (If_DsdObj_t *)Mem_FlexEntryFetch( p->pMem, sizeof(word) * nWords );
    If_DsdObjClean( pObj );
    pObj->Type   = Type;
    pObj->nFans  = nFans;
    pObj->Id     = Vec_PtrSize( &p->vObjs );
    pObj->fMark  = p->fNewAsUseless;
    pObj->Count  = 0;
    Vec_PtrPush( &p->vObjs, pObj );
    Vec_IntPush( &p->vNexts, 0 );
    Vec_IntPush( &p->vTruths, -1 );
    assert( Vec_IntSize(&p->vNexts) == Vec_PtrSize(&p->vObjs) );
    assert( Vec_IntSize(&p->vTruths) == Vec_PtrSize(&p->vObjs) );
    return pObj;
}